

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  uchar *puVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  size_t i;
  uint *bitlen;
  uint *puVar6;
  byte bVar7;
  uint uVar8;
  ulong size;
  uint *puVar9;
  uint uVar10;
  int iVar11;
  uint *puVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uchar *src;
  uint *bitlen_00;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  LodePNGBitReader local_118;
  uint *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  uint local_d0;
  uint local_cc;
  long local_c8;
  LodePNGDecompressSettings *local_c0;
  HuffmanTree local_b8;
  HuffmanTree tree_ll;
  HuffmanTree local_58;
  
  local_118.bitsize = insize * 8;
  if (local_118.bitsize < 0xffffffffffffffc0 && insize >> 0x3d == 0) {
    local_118.bp = 0;
    local_118.buffer = 0;
    uVar10 = 0;
    local_118.data = in;
    local_118.size = insize;
    local_c0 = settings;
    do {
      if (uVar10 != 0) {
        return 0;
      }
      uVar4 = ensureBits9(&local_118,3);
      sVar3 = local_118.size;
      puVar1 = local_118.data;
      if (uVar4 == 0) {
        return 0x34;
      }
      uVar10 = local_118.buffer >> 3;
      uVar17 = local_118.bp + 3;
      uVar4 = local_118.buffer >> 1 & 3;
      local_cc = local_118.buffer;
      local_118.buffer = uVar10;
      if (uVar4 == 0) {
        uVar13 = local_118.bp + 10 >> 3;
        uVar16 = uVar13 + 4;
        if (local_118.size <= uVar16) {
          return 0x34;
        }
        size = (ulong)*(ushort *)(local_118.data + uVar13);
        if ((local_c0->ignore_nlen == 0) &&
           ((uint)*(ushort *)(local_118.data + uVar13 + 2) +
            (uint)*(ushort *)(local_118.data + uVar13) != 0xffff)) {
          return 0x15;
        }
        local_118.bp = uVar17;
        uVar4 = ucvector_resize(out,out->size + size);
        if (uVar4 == 0) {
          return 0x53;
        }
        if (sVar3 < uVar16 + size) {
          return 0x17;
        }
        lodepng_memcpy(out->data + (out->size - size),puVar1 + uVar16,size);
        local_118.bp = (uVar16 + size) * 8;
        uVar4 = 0;
      }
      else {
        if (uVar4 == 3) {
          return 0x14;
        }
        tree_ll.codes = (uint *)0x0;
        tree_ll.lengths = (uint *)0x0;
        tree_ll.table_len = (uchar *)0x0;
        tree_ll.table_value = (unsigned_short *)0x0;
        local_b8.codes = (uint *)0x0;
        local_b8.lengths = (uint *)0x0;
        local_b8.table_len = (uchar *)0x0;
        local_b8.table_value = (unsigned_short *)0x0;
        if (uVar4 == 1) {
          local_118.bp = uVar17;
          uVar4 = generateFixedLitLenTree(&tree_ll);
          if (uVar4 == 0) {
            uVar4 = generateFixedDistanceTree(&local_b8);
          }
        }
        else {
          local_118.bp = uVar17;
          uVar5 = ensureBits17(&local_118,0xe);
          uVar10 = local_118.buffer;
          uVar4 = 0x31;
          if (uVar5 != 0) {
            local_118.buffer = local_118.buffer >> 0xe;
            uVar17 = local_118.bp + 0xe;
            local_118.bp = uVar17;
            bitlen = (uint *)malloc(0x4c);
            uVar4 = 0x53;
            if (bitlen != (uint *)0x0) {
              uVar13 = (ulong)(uVar10 >> 10 & 0xf);
              local_58.codes = (uint *)0x0;
              local_58.lengths = (uint *)0x0;
              local_58.table_len = (uchar *)0x0;
              local_58.table_value = (unsigned_short *)0x0;
              uVar16 = (uVar13 + 4) * 3 + uVar17;
              uVar4 = 0x32;
              if (uVar16 < uVar17) {
LAB_001242a1:
                bitlen_00 = (uint *)0x0;
                puVar6 = (uint *)0x0;
              }
              else {
                bitlen_00 = (uint *)0x0;
                puVar6 = (uint *)0x0;
                if (uVar16 <= local_118.bitsize) {
                  local_d8 = (ulong)(uVar10 & 0x1f);
                  local_e8 = local_d8 + 0x101;
                  local_e0 = (ulong)((uVar10 >> 5 & 0x1f) + 1);
                  for (lVar15 = 0; uVar17 = local_e0, uVar13 * 4 + 0x10 != lVar15;
                      lVar15 = lVar15 + 4) {
                    ensureBits9(&local_118,3);
                    local_118.bp = local_118.bp + 3;
                    bitlen[*(uint *)((long)CLCL_ORDER + lVar15)] = local_118.buffer & 7;
                    local_118.buffer = local_118.buffer >> 3;
                  }
                  for (; uVar13 != 0xf; uVar13 = uVar13 + 1) {
                    bitlen[CLCL_ORDER[uVar13 + 4]] = 0;
                  }
                  uVar4 = HuffmanTree_makeFromLengths(&local_58,bitlen,0x13,7);
                  if (uVar4 != 0) goto LAB_001242a1;
                  puVar6 = (uint *)malloc(0x480);
                  bitlen_00 = (uint *)malloc(0x80);
                  if (bitlen_00 == (uint *)0x0 || puVar6 == (uint *)0x0) {
                    uVar4 = 0x53;
                  }
                  else {
                    for (lVar15 = 0; lVar15 != 0x480; lVar15 = lVar15 + 1) {
                      *(undefined1 *)((long)puVar6 + lVar15) = 0;
                    }
                    for (lVar15 = 0; lVar15 != 0x80; lVar15 = lVar15 + 1) {
                      *(undefined1 *)((long)bitlen_00 + lVar15) = 0;
                    }
                    local_e0 = (ulong)(uint)((int)uVar17 + (int)local_e8);
                    local_d0 = (int)local_d8 + 0x102;
                    uVar4 = -(int)local_d8;
                    local_d8 = (ulong)uVar4;
                    local_c8 = (long)(int)uVar4 + -0x101;
                    uVar4 = 0;
                    uVar17 = 0;
                    local_f0 = puVar6;
                    do {
                      uVar10 = (uint)uVar17;
                      if ((uint)local_e0 <= uVar10) {
                        puVar6 = local_f0;
                        if (uVar4 == 0) {
                          if (local_f0[0x100] == 0) {
                            uVar4 = 0x40;
                          }
                          else {
                            uVar4 = HuffmanTree_makeFromLengths(&tree_ll,local_f0,0x120,0xf);
                            puVar6 = local_f0;
                            if (uVar4 == 0) {
                              uVar4 = HuffmanTree_makeFromLengths(&local_b8,bitlen_00,0x20,0xf);
                              puVar6 = local_f0;
                            }
                          }
                        }
                        goto LAB_00124528;
                      }
                      ensureBits25(&local_118,0x16);
                      uVar5 = huffmanDecodeSymbol(&local_118,&local_58);
                      puVar6 = local_f0;
                      if (uVar5 < 0x10) {
                        uVar8 = (uint)local_e8;
                        puVar12 = bitlen_00;
                        if (uVar10 < uVar8) {
                          uVar8 = 0;
                          puVar12 = local_f0;
                        }
                        puVar12[uVar10 - uVar8] = uVar5;
                        uVar17 = (ulong)(uVar10 + 1);
                      }
                      else {
                        uVar17 = uVar17 & 0xffffffff;
                        iVar2 = (int)local_c8;
                        if (uVar5 == 0x12) {
                          uVar10 = local_118.buffer & 0x7f;
                          local_118.buffer = local_118.buffer >> 7;
                          local_118.bp = local_118.bp + 7;
                          iVar11 = uVar10 + 0xb;
                          puVar12 = local_f0 + uVar17;
                          while (bVar19 = iVar11 != 0, iVar11 = iVar11 + -1, bVar19) {
                            if (local_e0 == uVar17) {
                              uVar4 = 0xf;
                              break;
                            }
                            puVar9 = bitlen_00 + (uint)(iVar2 + (int)uVar17);
                            if (uVar17 < local_e8) {
                              puVar9 = puVar12;
                            }
                            *puVar9 = 0;
                            uVar17 = uVar17 + 1;
                            puVar12 = puVar12 + 1;
                          }
                        }
                        else if (uVar5 == 0x11) {
                          uVar10 = local_118.buffer & 7;
                          local_118.buffer = local_118.buffer >> 3;
                          local_118.bp = local_118.bp + 3;
                          iVar11 = uVar10 + 3;
                          puVar12 = local_f0 + uVar17;
                          while (bVar19 = iVar11 != 0, iVar11 = iVar11 + -1, bVar19) {
                            if (local_e0 == uVar17) {
                              uVar4 = 0xe;
                              break;
                            }
                            puVar9 = bitlen_00 + (uint)(iVar2 + (int)uVar17);
                            if (uVar17 < local_e8) {
                              puVar9 = puVar12;
                            }
                            *puVar9 = 0;
                            uVar17 = uVar17 + 1;
                            puVar12 = puVar12 + 1;
                          }
                        }
                        else {
                          if (uVar5 != 0x10) {
                            uVar4 = 0x10;
                            goto LAB_00124528;
                          }
                          if (uVar10 == 0) {
                            uVar4 = 0x36;
                            goto LAB_00124528;
                          }
                          uVar5 = local_118.buffer & 3;
                          local_118.buffer = local_118.buffer >> 2;
                          local_118.bp = local_118.bp + 2;
                          iVar11 = uVar5 + 3;
                          puVar12 = bitlen_00 + ((uVar10 - 0x102) + (int)local_d8);
                          if (uVar10 < local_d0) {
                            puVar12 = local_f0 + (uVar10 - 1);
                          }
                          uVar10 = *puVar12;
                          puVar12 = local_f0 + uVar17;
                          while (bVar19 = iVar11 != 0, iVar11 = iVar11 + -1, bVar19) {
                            if (local_e0 == uVar17) {
                              uVar4 = 0xd;
                              break;
                            }
                            puVar9 = bitlen_00 + (uint)(iVar2 + (int)uVar17);
                            if (uVar17 < local_e8) {
                              puVar9 = puVar12;
                            }
                            *puVar9 = uVar10;
                            uVar17 = uVar17 + 1;
                            puVar12 = puVar12 + 1;
                          }
                        }
                      }
                    } while (local_118.bp <= local_118.bitsize);
                    uVar4 = 0x32;
                  }
                }
              }
LAB_00124528:
              free(bitlen);
              free(puVar6);
              free(bitlen_00);
              HuffmanTree_cleanup(&local_58);
            }
          }
        }
        do {
          if (uVar4 != 0) goto LAB_00124710;
          ensureBits25(&local_118,0x14);
          uVar4 = huffmanDecodeSymbol(&local_118,&tree_ll);
          if (uVar4 < 0x100) {
            uVar10 = ucvector_resize(out,out->size + 1);
            if (uVar10 == 0) {
              uVar4 = 0x53;
              goto LAB_00124710;
            }
            out->data[out->size - 1] = (uchar)uVar4;
          }
          else {
            if ((uVar4 == 0x100) || (0x11d < uVar4)) {
              uVar4 = (uint)(uVar4 != 0x100) << 4;
              goto LAB_00124710;
            }
            uVar17 = (ulong)(uVar4 - 0x101);
            uVar16 = (ulong)LENGTHBASE[uVar17];
            if (0xffffffffffffffeb < uVar17 - 0x1c) {
              bVar7 = (byte)LENGTHEXTRA[uVar17];
              uVar4 = ~(-1 << (bVar7 & 0x1f)) & local_118.buffer;
              local_118.buffer = local_118.buffer >> (bVar7 & 0x1f);
              local_118.bp = local_118.bp + LENGTHEXTRA[uVar17];
              uVar16 = uVar16 + uVar4;
            }
            ensureBits32(&local_118,0x1c);
            uVar4 = huffmanDecodeSymbol(&local_118,&local_b8);
            if (0x1d < uVar4) {
              uVar4 = (uint)(uVar4 < 0x20) * 2 + 0x10;
              goto LAB_00124710;
            }
            uVar10 = DISTANCEBASE[uVar4];
            if (3 < uVar4) {
              bVar7 = (byte)DISTANCEEXTRA[uVar4];
              uVar5 = ~(-1 << (bVar7 & 0x1f)) & local_118.buffer;
              local_118.buffer = local_118.buffer >> (bVar7 & 0x1f);
              local_118.bp = local_118.bp + DISTANCEEXTRA[uVar4];
              uVar10 = uVar10 + uVar5;
            }
            uVar17 = out->size;
            uVar13 = (ulong)uVar10;
            lVar15 = uVar17 - uVar13;
            if (uVar17 < uVar13) {
              uVar4 = 0x34;
              goto LAB_00124710;
            }
            uVar4 = ucvector_resize(out,uVar17 + uVar16);
            if (uVar4 == 0) {
              uVar4 = 0x53;
              goto LAB_00124710;
            }
            puVar1 = out->data + uVar17;
            src = out->data + lVar15;
            lVar14 = uVar16 - uVar13;
            if (uVar16 < uVar13 || lVar14 == 0) {
              lodepng_memcpy(puVar1,src,uVar16);
            }
            else {
              lodepng_memcpy(puVar1,src,uVar13);
              lVar18 = uVar17 + uVar13;
              while (bVar19 = lVar14 != 0, lVar14 = lVar14 + -1, bVar19) {
                puVar1 = out->data + lVar15;
                lVar15 = lVar15 + 1;
                out->data[lVar18] = *puVar1;
                lVar18 = lVar18 + 1;
              }
            }
          }
          uVar4 = 0;
        } while (local_118.bp <= local_118.bitsize);
        uVar4 = 0x33;
LAB_00124710:
        HuffmanTree_cleanup(&tree_ll);
        HuffmanTree_cleanup(&local_b8);
      }
      uVar10 = local_cc & 1;
    } while (uVar4 == 0);
  }
  else {
    uVar4 = 0x69;
  }
  return uVar4;
}

Assistant:

static unsigned lodepng_inflatev(ucvector* out,
  const unsigned char* in, size_t insize,
  const LodePNGDecompressSettings* settings) {
  unsigned BFINAL = 0;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, in, insize);

  if (error) return error;

  while (!BFINAL) {
    unsigned BTYPE;
    if (!ensureBits9(&reader, 3)) return 52; /*error, bit pointer will jump past memory*/
    BFINAL = readBits(&reader, 1);
    BTYPE = readBits(&reader, 2);

    if (BTYPE == 3) return 20; /*error: invalid BTYPE*/
    else if (BTYPE == 0) error = inflateNoCompression(out, &reader, settings); /*no compression*/
    else error = inflateHuffmanBlock(out, &reader, BTYPE); /*compression, BTYPE 01 or 10*/

    if (error) return error;
  }

  return error;
}